

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void image_memory_write(png_structp png_ptr,png_bytep data,size_t size)

{
  png_voidp pvVar1;
  long lVar2;
  png_alloc_size_t ob;
  png_image_write_control *display;
  size_t size_local;
  png_bytep data_local;
  png_structp png_ptr_local;
  
  pvVar1 = png_ptr->io_ptr;
  lVar2 = *(long *)((long)pvVar1 + 0x50);
  if (size <= -lVar2 - 1U) {
    if (size != 0) {
      if (lVar2 + size <= *(ulong *)((long)pvVar1 + 0x48)) {
        memcpy((void *)(*(long *)((long)pvVar1 + 0x40) + lVar2),data,size);
      }
      *(size_t *)((long)pvVar1 + 0x50) = lVar2 + size;
    }
    return;
  }
  png_error(png_ptr,"png_image_write_to_memory: PNG too big");
}

Assistant:

static void (PNGCBAPI
image_memory_write)(png_structp png_ptr, png_bytep/*const*/ data, size_t size)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       png_ptr->io_ptr/*backdoor: png_get_io_ptr(png_ptr)*/);
   png_alloc_size_t ob = display->output_bytes;

   /* Check for overflow; this should never happen: */
   if (size <= ((png_alloc_size_t)-1) - ob)
   {
      /* I don't think libpng ever does this, but just in case: */
      if (size > 0)
      {
         if (display->memory_bytes >= ob+size) /* writing */
            memcpy(display->memory+ob, data, size);

         /* Always update the size: */
         display->output_bytes = ob+size;
      }
   }

   else
      png_error(png_ptr, "png_image_write_to_memory: PNG too big");
}